

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

void __thiscall OSToken::OSToken(OSToken *this,string *inTokenPath,int inUmask)

{
  bool bVar1;
  Directory *pDVar2;
  Generation *__lhs;
  ObjectFile *__rhs;
  MutexFactory *this_00;
  Mutex *pMVar3;
  undefined8 uVar4;
  int in_EDX;
  int __c;
  string *in_RSI;
  OSToken *in_RDI;
  string *this_01;
  undefined6 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe86;
  undefined1 in_stack_fffffffffffffe87;
  byte bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  char *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *psVar6;
  Directory *this_02;
  string local_110 [15];
  undefined1 in_stack_fffffffffffffeff;
  string *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  string *in_stack_ffffffffffffff10;
  OSToken *in_stack_ffffffffffffff18;
  ObjectFile *in_stack_ffffffffffffff20;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [39];
  undefined1 local_49;
  string local_48 [52];
  int local_14;
  
  local_14 = in_EDX;
  ObjectStoreToken::ObjectStoreToken(&in_RDI->super_ObjectStoreToken);
  (in_RDI->super_ObjectStoreToken)._vptr_ObjectStoreToken = (_func_int **)&PTR_setSOPIN_0017cd88;
  this_01 = &in_RDI->tokenPath;
  std::__cxx11::string::string((string *)this_01);
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1432d5);
  psVar6 = &in_RDI->allObjects;
  std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::set
            ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)0x1432e8);
  this_02 = (Directory *)&in_RDI->currentFiles;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x1432fe);
  std::__cxx11::string::operator=((string *)this_01,in_RSI);
  in_RDI->umask = local_14;
  pDVar2 = (Directory *)operator_new(0x68);
  local_49 = 1;
  std::__cxx11::string::string(local_48,(string *)&in_RDI->tokenPath);
  Directory::Directory(this_02,(string *)in_RDI);
  local_49 = 0;
  in_RDI->tokenDir = pDVar2;
  std::__cxx11::string::~string(local_48);
  std::operator+(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::operator+(in_stack_fffffffffffffe88,
                 (char *)CONCAT17(in_stack_fffffffffffffe87,
                                  CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
  __lhs = Generation::create((string *)in_RDI,(int)((ulong)psVar6 >> 0x20),
                             SUB81((ulong)psVar6 >> 0x18,0));
  in_RDI->gen = __lhs;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  __rhs = (ObjectFile *)operator_new(0xb0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)__rhs);
  std::operator+(in_stack_fffffffffffffe88,
                 (char *)CONCAT17(in_stack_fffffffffffffe87,
                                  CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)__rhs);
  std::operator+(in_stack_fffffffffffffe88,
                 (char *)CONCAT17(in_stack_fffffffffffffe87,
                                  CONCAT16(in_stack_fffffffffffffe86,in_stack_fffffffffffffe80)));
  ObjectFile::ObjectFile
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00,(bool)in_stack_fffffffffffffeff);
  in_RDI->tokenObject = __rhs;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  this_00 = MutexFactory::i();
  pMVar3 = MutexFactory::getMutex(this_00);
  in_RDI->tokenMutex = pMVar3;
  bVar5 = 0;
  if ((in_RDI->gen != (Generation *)0x0) && (bVar5 = 0, in_RDI->tokenMutex != (Mutex *)0x0)) {
    bVar1 = Directory::isValid(in_RDI->tokenDir);
    bVar5 = 0;
    if (bVar1) {
      bVar5 = in_RDI->tokenObject->valid;
    }
  }
  in_RDI->valid = (bool)(bVar5 & 1);
  uVar4 = std::__cxx11::string::c_str();
  softHSMLog(7,"OSToken",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,0x41,"Opened token %s",uVar4);
  index(in_RDI,(char *)0x1,__c);
  return;
}

Assistant:

OSToken::OSToken(const std::string inTokenPath, int inUmask)
{
	tokenPath = inTokenPath;
	umask = inUmask;

	tokenDir = new Directory(tokenPath);
	gen = Generation::create(tokenPath + OS_PATHSEP + "generation", umask, true);
	tokenObject = new ObjectFile(this, tokenPath + OS_PATHSEP + "token.object", umask, tokenPath + OS_PATHSEP + "token.lock");
	tokenMutex = MutexFactory::i()->getMutex();
	valid = (gen != NULL) && (tokenMutex != NULL) && tokenDir->isValid() && tokenObject->valid;

	DEBUG_MSG("Opened token %s", tokenPath.c_str());

	index(true);
}